

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

bool wallet::IsDust(CRecipient *recipient,CFeeRate *dustRelayFee)

{
  bool bVar1;
  long in_FS_OFFSET;
  CScriptBase in_stack_ffffffffffffff98;
  CTxOut local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&stack0xffffffffffffff98,&recipient->dest);
  CTxOut::CTxOut(&local_48,&recipient->nAmount,(CScript)in_stack_ffffffffffffff98);
  bVar1 = ::IsDust(&local_48,dustRelayFee);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&local_48.scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&stack0xffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool IsDust(const CRecipient& recipient, const CFeeRate& dustRelayFee)
{
    return ::IsDust(CTxOut(recipient.nAmount, GetScriptForDestination(recipient.dest)), dustRelayFee);
}